

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_transaction_tests.cpp
# Opt level: O2

void __thiscall wallet::wallet_transaction_tests::roundtrip::test_method(roundtrip *this)

{
  bool bVar1;
  iterator in_R8;
  iterator pvVar2;
  Overloaded<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:114:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:115:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:116:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:117:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:118:9)>
  *in_R9;
  Overloaded<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:114:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:115:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:116:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:117:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:118:9)>
  *pOVar3;
  Overloaded<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:102:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:103:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:104:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:105:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:106:9)>
  OVar4;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  int local_dc;
  Overloaded<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:102:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:103:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:104:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:105:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:106:9)>
  local_d8;
  undefined8 local_d7;
  undefined7 uStack_cf;
  undefined1 uStack_c8;
  undefined7 uStack_c7;
  undefined8 uStack_c0;
  int local_b8 [8];
  _Variadic_union<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
  local_98;
  byte local_70;
  undefined1 local_60 [24];
  undefined8 uStack_48;
  int local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  OVar4 = (Overloaded<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:102:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:103:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:104:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:105:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:106:9)>
           )0x0;
  do {
    if (OVar4 == (Overloaded<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:102:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:103:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:104:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:105:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:106:9)>
                  )0x5) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
    local_dc = -2;
    while( true ) {
      if (2 < local_dc) break;
      local_60[0x11] = '\0';
      local_60[0x12] = '\0';
      local_60[0x13] = '\0';
      local_60[0x14] = '\0';
      local_60[0x15] = '\0';
      local_60[0x16] = '\0';
      local_60[0x17] = '\0';
      uStack_48._0_1_ = '\0';
      uStack_48._1_1_ = '\0';
      uStack_48._2_1_ = '\0';
      uStack_48._3_1_ = '\0';
      uStack_48._4_1_ = '\0';
      uStack_48._5_1_ = '\0';
      uStack_48._6_1_ = '\0';
      uStack_48._7_1_ = '\0';
      local_60[1] = '\0';
      local_60[2] = '\0';
      local_60[3] = '\0';
      local_60[4] = '\0';
      local_60[5] = '\0';
      local_60[6] = '\0';
      local_60[7] = '\0';
      local_60[8] = '\0';
      local_60[9] = '\0';
      local_60[10] = '\0';
      local_60[0xb] = '\0';
      local_60[0xc] = '\0';
      local_60[0xd] = '\0';
      local_60[0xe] = '\0';
      local_60[0xf] = '\0';
      local_60[0x10] = '\0';
      local_60[0] = OVar4;
      local_40 = local_dc;
      bVar1 = ::operator==((base_blob<256U> *)local_60,&uint256::ZERO.super_base_blob<256U>);
      if (bVar1) {
        if (local_40 == 0) {
          local_98._0_8_ = local_98._0_8_ & 0xffffffffffffff00;
LAB_0067bbd1:
          local_70 = 3;
        }
        else {
LAB_0067bc15:
          local_98._M_first._M_storage.confirmed_block_height = local_40;
          local_98._0_8_ = CONCAT71(local_60._1_7_,local_60[0]);
          local_98._8_8_ = CONCAT71(local_60._9_7_,local_60[8]);
          local_98._16_8_ = CONCAT71(local_60._17_7_,local_60[0x10]);
          local_98._M_first._M_storage.confirmed_block_hash.super_base_blob<256U>.m_data._M_elems
          [0x18] = (uchar)uStack_48;
          local_98._M_first._M_storage.confirmed_block_hash.super_base_blob<256U>.m_data._M_elems
          [0x19] = uStack_48._1_1_;
          local_98._M_first._M_storage.confirmed_block_hash.super_base_blob<256U>.m_data._M_elems
          [0x1a] = uStack_48._2_1_;
          local_98._M_first._M_storage.confirmed_block_hash.super_base_blob<256U>.m_data._M_elems
          [0x1b] = uStack_48._3_1_;
          local_98._M_first._M_storage.confirmed_block_hash.super_base_blob<256U>.m_data._M_elems
          [0x1c] = uStack_48._4_1_;
          local_98._M_first._M_storage.confirmed_block_hash.super_base_blob<256U>.m_data._M_elems
          [0x1d] = uStack_48._5_1_;
          local_98._M_first._M_storage.confirmed_block_hash.super_base_blob<256U>.m_data._M_elems
          [0x1e] = uStack_48._6_1_;
          local_98._M_first._M_storage.confirmed_block_hash.super_base_blob<256U>.m_data._M_elems
          [0x1f] = uStack_48._7_1_;
          local_70 = 4;
        }
      }
      else {
        bVar1 = ::operator==((base_blob<256U> *)local_60,&uint256::ONE.super_base_blob<256U>);
        if (bVar1) {
          if (local_40 != -1) goto LAB_0067bc15;
          local_98._M_first._M_storage.confirmed_block_hash.super_base_blob<256U>.m_data._M_elems[0]
               = 1;
          goto LAB_0067bbd1;
        }
        if (local_40 < 0) {
          if (local_40 != -1) goto LAB_0067bc15;
          local_98._0_8_ = CONCAT71(local_60._1_7_,local_60[0]);
          local_98._8_8_ = CONCAT71(local_60._9_7_,local_60[8]);
          local_98._16_8_ = CONCAT71(local_60._17_7_,local_60[0x10]);
          local_98._M_first._M_storage.confirmed_block_hash.super_base_blob<256U>.m_data._M_elems
          [0x18] = (uchar)uStack_48;
          local_98._M_first._M_storage.confirmed_block_hash.super_base_blob<256U>.m_data._M_elems
          [0x19] = uStack_48._1_1_;
          local_98._M_first._M_storage.confirmed_block_hash.super_base_blob<256U>.m_data._M_elems
          [0x1a] = uStack_48._2_1_;
          local_98._M_first._M_storage.confirmed_block_hash.super_base_blob<256U>.m_data._M_elems
          [0x1b] = uStack_48._3_1_;
          local_98._M_first._M_storage.confirmed_block_hash.super_base_blob<256U>.m_data._M_elems
          [0x1c] = uStack_48._4_1_;
          local_98._M_first._M_storage.confirmed_block_hash.super_base_blob<256U>.m_data._M_elems
          [0x1d] = uStack_48._5_1_;
          local_98._M_first._M_storage.confirmed_block_hash.super_base_blob<256U>.m_data._M_elems
          [0x1e] = uStack_48._6_1_;
          local_98._M_first._M_storage.confirmed_block_hash.super_base_blob<256U>.m_data._M_elems
          [0x1f] = uStack_48._7_1_;
          local_98._M_first._M_storage.confirmed_block_height = -1;
          local_70 = 2;
        }
        else {
          local_98._0_8_ = CONCAT71(local_60._1_7_,local_60[0]);
          local_98._8_8_ = CONCAT71(local_60._9_7_,local_60[8]);
          local_98._16_8_ = CONCAT71(local_60._17_7_,local_60[0x10]);
          local_98._M_first._M_storage.confirmed_block_hash.super_base_blob<256U>.m_data._M_elems
          [0x18] = (uchar)uStack_48;
          local_98._M_first._M_storage.confirmed_block_hash.super_base_blob<256U>.m_data._M_elems
          [0x19] = uStack_48._1_1_;
          local_98._M_first._M_storage.confirmed_block_hash.super_base_blob<256U>.m_data._M_elems
          [0x1a] = uStack_48._2_1_;
          local_98._M_first._M_storage.confirmed_block_hash.super_base_blob<256U>.m_data._M_elems
          [0x1b] = uStack_48._3_1_;
          local_98._M_first._M_storage.confirmed_block_hash.super_base_blob<256U>.m_data._M_elems
          [0x1c] = uStack_48._4_1_;
          local_98._M_first._M_storage.confirmed_block_hash.super_base_blob<256U>.m_data._M_elems
          [0x1d] = uStack_48._5_1_;
          local_98._M_first._M_storage.confirmed_block_hash.super_base_blob<256U>.m_data._M_elems
          [0x1e] = uStack_48._6_1_;
          local_98._M_first._M_storage.confirmed_block_hash.super_base_blob<256U>.m_data._M_elems
          [0x1f] = uStack_48._7_1_;
          local_98._M_first._M_storage.confirmed_block_height = -1;
          local_98._M_first._M_storage.position_in_block = local_40;
          local_70 = 0;
        }
      }
      local_f0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_transaction_tests.cpp"
      ;
      local_e8 = "";
      local_100 = &boost::unit_test::basic_cstring<char_const>::null;
      local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
      file.m_end = (iterator)0x13;
      file.m_begin = (iterator)&local_f0;
      msg.m_end = (iterator)in_R9;
      msg.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_100,msg)
      ;
      local_60[8] = '\0';
      local_60[0] = (Overloaded<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:102:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:103:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:104:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:105:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:106:9)>
                     )0xb0;
      local_60[1] = 0x80;
      local_60[2] = '\x14';
      local_60[3] = '\x01';
      local_60[4] = '\0';
      local_60[5] = '\0';
      local_60[6] = '\0';
      local_60[7] = '\0';
      local_60[0x10] = '@';
      local_60[0x11] = 0xc1;
      local_60[0x12] = '\x15';
      local_60[0x13] = '\x01';
      local_60[0x14] = '\0';
      local_60[0x15] = '\0';
      local_60[0x16] = '\0';
      local_60[0x17] = '\0';
      uStack_48 = "";
      local_110 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_transaction_tests.cpp"
      ;
      local_108 = "";
      in_R9 = (Overloaded<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:114:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:115:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:116:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:117:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:118:9)>
               *)local_b8;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__deduce_visit_result<uint256>,_util::Overloaded<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/transaction.h:102:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/transaction.h:103:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/transaction.h:104:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/transaction.h:105:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/transaction.h:106:9)>_&&,_const_std::variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>_&>
        ::_S_vtable._M_arr[local_70]._M_data)
                ((uint256 *)in_R9,&local_d8,
                 (variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                  *)&local_98._M_first);
      uStack_c7 = 0;
      uStack_c0 = 0;
      local_d7 = 0;
      uStack_cf = 0;
      uStack_c8 = 0;
      pvVar2 = (iterator)0x2;
      pOVar3 = in_R9;
      local_d8 = OVar4;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
                (local_60,&local_110,0x13,1,2,in_R9,"TxStateSerializedBlockHash(state)",&local_d8,
                 "uint256{hash}");
      local_120 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_transaction_tests.cpp"
      ;
      local_118 = "";
      local_130 = &boost::unit_test::basic_cstring<char_const>::null;
      local_128 = &boost::unit_test::basic_cstring<char_const>::null;
      file_00.m_end = (iterator)0x14;
      file_00.m_begin = (iterator)&local_120;
      msg_00.m_end = (iterator)pOVar3;
      msg_00.m_begin = pvVar2;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_130,
                 msg_00);
      local_60[8] = '\0';
      local_60[0] = (Overloaded<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:102:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:103:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:104:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:105:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:106:9)>
                     )0xb0;
      local_60[1] = 0x80;
      local_60[2] = '\x14';
      local_60[3] = '\x01';
      local_60[4] = '\0';
      local_60[5] = '\0';
      local_60[6] = '\0';
      local_60[7] = '\0';
      local_60[0x10] = '@';
      local_60[0x11] = 0xc1;
      local_60[0x12] = '\x15';
      local_60[0x13] = '\x01';
      local_60[0x14] = '\0';
      local_60[0x15] = '\0';
      local_60[0x16] = '\0';
      local_60[0x17] = '\0';
      uStack_48 = "";
      local_140 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/test/wallet_transaction_tests.cpp"
      ;
      local_138 = "";
      local_b8[0] = (*std::__detail::__variant::
                      __gen_vtable<std::__detail::__variant::__deduce_visit_result<int>,_util::Overloaded<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/transaction.h:114:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/transaction.h:115:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/transaction.h:116:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/transaction.h:117:9),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/transaction.h:118:9)>_&&,_const_std::variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>_&>
                      ::_S_vtable._M_arr[local_70]._M_data)
                              (in_R9,(variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                                      *)&local_98._M_first);
      in_R8 = (iterator)0x2;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
                (local_60,&local_140,0x14,1,2,in_R9,"TxStateSerializedIndex(state)",&local_dc,
                 "index");
      local_dc = local_dc + 1;
    }
    OVar4 = (Overloaded<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:102:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:103:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:104:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:105:9),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_wallet_transaction_h:106:9)>
             )((char)OVar4 + '\x01');
  } while( true );
}

Assistant:

BOOST_AUTO_TEST_CASE(roundtrip)
{
    for (uint8_t hash = 0; hash < 5; ++hash) {
        for (int index = -2; index < 3; ++index) {
            TxState state = TxStateInterpretSerialized(TxStateUnrecognized{uint256{hash}, index});
            BOOST_CHECK_EQUAL(TxStateSerializedBlockHash(state), uint256{hash});
            BOOST_CHECK_EQUAL(TxStateSerializedIndex(state), index);
        }
    }
}